

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_aout.c
# Opt level: O0

int aout_findsym(char *name,bool be)

{
  SymbolNode_conflict *pSVar1;
  int iVar2;
  unsigned_long uVar3;
  char *in_RDI;
  SymbolNode_conflict *sym;
  SymbolNode_conflict **chain;
  SymbolNode_conflict **local_20;
  
  local_20 = aoutsymlist.hashtab;
  uVar3 = elf_hash(in_RDI);
  local_20 = local_20 + (uVar3 & 0xffff);
  while( true ) {
    pSVar1 = *local_20;
    if (pSVar1 == (SymbolNode_conflict *)0x0) {
      return -1;
    }
    iVar2 = strcmp(in_RDI,pSVar1->name);
    if (iVar2 == 0) break;
    local_20 = &pSVar1->hashchain;
  }
  return pSVar1->index;
}

Assistant:

static int aout_findsym(const char *name,bool be)
/* find a symbol by its name, return symbol table index or -1 */
{
  struct SymbolNode **chain = &aoutsymlist.hashtab[elf_hash(name)%SYMHTABSIZE];
  struct SymbolNode *sym;

  while (sym = *chain) {
    if (!strcmp(name,sym->name))
      return ((int)sym->index);
    chain = &sym->hashchain;
  }
  return (-1);
}